

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::attach_peer(torrent *this,peer_connection *p)

{
  pointer *this_00;
  session_interface *psVar1;
  peer_connection *ppVar2;
  peer_connection_interface pVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  peer_class_t c;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  base *__variants;
  type c_00;
  context_handle_type c_01;
  element_type *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_endpoint<boost::asio::ip::tcp> *pbVar11;
  undefined4 extraout_var_01;
  peer_class *ppVar12;
  undefined4 extraout_var_02;
  reference pppVar13;
  element_type *peVar14;
  pointer this_02;
  undefined8 uVar15;
  size_type sVar16;
  long lVar17;
  undefined8 uVar18;
  peer_connection_interface *c_02;
  int __type;
  vector<peer_connection_*> *this_03;
  undefined1 auVar19 [16];
  byte local_541;
  exception *anon_var_0;
  undefined1 local_380 [40];
  string local_358;
  undefined1 local_331;
  error_code local_330;
  string local_320;
  peer_connection_interface local_300;
  peer_connection *peer;
  error_code local_2f0;
  string local_2e0;
  undefined1 local_2c0 [8];
  torrent_state st;
  undefined1 local_200 [48];
  undefined1 local_1d0 [8];
  shared_ptr<libtorrent::peer_plugin> pp;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  error_code local_198;
  undefined1 local_181;
  error_code local_180;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_170;
  undefined1 local_168 [24];
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  i_1;
  bool maybe_replace_peer;
  int64_t limit;
  int f;
  undefined4 local_12c;
  peer_class_t pc;
  int i;
  int connection_limit_factor;
  undefined1 local_109;
  error_code local_108;
  undefined1 local_f1;
  error_code local_f0;
  undefined1 local_d9;
  error_code local_d8;
  reason_t local_c4;
  undefined1 local_c0 [56];
  error_code local_88;
  undefined1 local_71;
  error_code local_70;
  undefined1 local_59;
  error_code local_58;
  ssl_handle_visitor local_41 [9];
  stream_handle_type stream_handle;
  socket_type *s;
  undefined8 local_20;
  peer_connection *p_local;
  torrent *this_local;
  
  local_20 = p;
  p_local = (peer_connection *)this;
  bVar4 = is_ssl_torrent(this);
  if (bVar4) {
    stream_handle = (stream_handle_type)peer_connection::get_socket((peer_connection *)local_20);
    __variants = polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 ::var((polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                        *)stream_handle);
    local_41._1_8_ =
         ::std::
         visit<libtorrent::aux::ssl_handle_visitor,std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                   (local_41,__variants);
    uVar15 = local_20;
    if ((__visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
         )local_41._1_8_ ==
        (__visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
         )0x0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_58,requires_ssl_connection,(type *)0x0);
      local_59 = 0;
      (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_58,1,0);
      this_local._7_1_ = 0;
      goto LAB_00691b47;
    }
    bVar4 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_ssl_ctx);
    uVar18 = local_20;
    uVar15 = local_41._1_8_;
    if (!bVar4) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_70,invalid_ssl_cert,(type *)0x0);
      local_71 = 0;
      (**(code **)(*(long *)uVar18 + 0xa0))(uVar18,&local_70,0x11,0);
      this_local._7_1_ = 0;
      goto LAB_00691b47;
    }
    c_00 = ::std::
           unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>::
           operator*(&this->m_ssl_ctx);
    c_01 = aux::ssl::get_handle(c_00);
    bVar4 = aux::ssl::has_context((stream_handle_type)uVar15,c_01);
    uVar15 = local_20;
    if (!bVar4) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_88,invalid_ssl_cert,(type *)0x0);
      local_c0[0x37] = 0;
      (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_88,1,0);
      this_local._7_1_ = 0;
      goto LAB_00691b47;
    }
  }
  this->field_0x5c0 = this->field_0x5c0 & 0xfb | 4;
  bVar4 = false;
  if ((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0) {
    bVar5 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ip_filter);
    bVar4 = false;
    if (bVar5) {
      this_01 = ::std::
                __shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_ip_filter);
      pbVar11 = (basic_endpoint<boost::asio::ip::tcp> *)(**(code **)(*(long *)local_20 + 0x80))();
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((address *)(local_c0 + 0x10),pbVar11);
      uVar6 = ip_filter::access(this_01,(char *)(local_c0 + 0x10),__type);
      bVar4 = (uVar6 & 1) != 0;
    }
  }
  if (bVar4) {
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar4 = alert_manager::should_post<libtorrent::peer_blocked_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar7));
    if (bVar4) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_c0);
      pbVar11 = (basic_endpoint<boost::asio::ip::tcp> *)(**(code **)(*(long *)local_20 + 0x80))();
      local_c4 = ip_filter;
      alert_manager::
      emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::peer_blocked_alert::reason_t>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar7),(torrent_handle *)local_c0,pbVar11
                 ,&local_c4);
      torrent_handle::~torrent_handle((torrent_handle *)local_c0);
    }
    uVar15 = local_20;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_d8,banned_by_ip_filter,(type *)0x0);
    local_d9 = 0;
    (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_d8,1,0);
    this_local._7_1_ = 0;
    goto LAB_00691b47;
  }
  bVar4 = anon_unknown_135::is_downloading_state
                    ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                           0x39) & 7);
  if ((!bVar4) && (bVar4 = valid_metadata(this), uVar15 = local_20, bVar4)) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_f0,torrent_not_ready,(type *)0x0);
    local_f1 = 0;
    (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_f0,1,0);
    this_local._7_1_ = 0;
    goto LAB_00691b47;
  }
  psVar1 = (this->super_torrent_hot_members).m_ses;
  uVar6 = (*(psVar1->super_session_logger)._vptr_session_logger[9])(psVar1,local_20);
  uVar15 = local_20;
  if ((uVar6 & 1) == 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_108,peer_not_constructed,(type *)0x0);
    local_109 = 0;
    (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_108,1,0);
    this_local._7_1_ = 0;
    goto LAB_00691b47;
  }
  uVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x11])();
  uVar15 = local_20;
  if ((uVar6 & 1) != 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&connection_limit_factor,session_closing,(type *)0x0);
    (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,(error_code *)&connection_limit_factor,1,0);
    this_local._7_1_ = 0;
    goto LAB_00691b47;
  }
  pc.m_val = 0;
  for (local_12c = 0; iVar7 = peer_class_set::num_classes((peer_class_set *)(local_20 + 0x34)),
      (int)local_12c < iVar7; local_12c = local_12c + 1) {
    c = peer_class_set::class_at((peer_class_set *)(local_20 + 0x34),local_12c);
    iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x32])();
    ppVar12 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_01,iVar7),c);
    if (ppVar12 != (peer_class *)0x0) {
      iVar7 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x32])();
      ppVar12 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_02,iVar7),c);
      if ((int)pc.m_val < ppVar12->connection_limit_factor) {
        pc.m_val = ppVar12->connection_limit_factor;
      }
    }
  }
  if (pc.m_val == 0) {
    pc.m_val = 100;
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
              0xffffff) * 100;
  i_1._M_current._7_1_ = 0;
  iVar7 = container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
          ::end_index(&(this->super_torrent_hot_members).m_connections);
  if (SUB168(auVar19 / SEXT816((long)(int)pc.m_val),0) <= (long)iVar7) {
    if (this->m_num_connecting == 0) {
      i_1._M_current._7_1_ = 1;
    }
    else {
      local_168._8_8_ = begin(this);
      local_168._0_8_ = end(this);
      local_168._16_8_ =
           ::std::
           max_element<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,bool(*)(libtorrent::aux::peer_connection_const*,libtorrent::aux::peer_connection_const*)>
                     ((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       )local_168._8_8_,
                      (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                       )local_168._0_8_,anon_unknown_135::connecting_time_compare);
      local_170._M_current = (peer_connection **)end(this);
      bVar4 = __gnu_cxx::operator==
                        ((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          *)(local_168 + 0x10),&local_170);
      local_541 = 1;
      if (!bVar4) {
        pppVar13 = __gnu_cxx::
                   __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                   ::operator*((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                *)(local_168 + 0x10));
        bVar4 = peer_connection::is_connecting(*pppVar13);
        local_541 = 1;
        if (bVar4) {
          pppVar13 = __gnu_cxx::
                     __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                     ::operator*((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                  *)(local_168 + 0x10));
          iVar7 = (*((*pppVar13)->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
          local_541 = (byte)iVar7;
        }
      }
      uVar15 = local_20;
      if ((local_541 & 1) != 0) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_180,too_many_connections,(type *)0x0);
        local_181 = 0;
        (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_180,1,0);
        this_local._7_1_ = 0;
        goto LAB_00691b47;
      }
      pppVar13 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                 ::operator*((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                              *)(local_168 + 0x10));
      ppVar2 = *pppVar13;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_198,too_many_connections,(type *)0x0);
      (*(ppVar2->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar2,&local_198,1,0);
      peer_connection::peer_disconnected_other((peer_connection *)local_20);
    }
  }
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
           ::begin(&this->m_extensions);
  ext = (shared_ptr<libtorrent::torrent_plugin> *)
        ::std::__cxx11::
        list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
        ::end(&this->m_extensions);
  while (bVar4 = ::std::operator!=(&__end2,(_Self *)&ext), bVar4) {
    pp.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*(&__end2);
    peVar14 = ::std::
              __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)pp.
                              super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    peer_connection::self((peer_connection *)local_200);
    ::std::weak_ptr<libtorrent::aux::peer_connection>::
    weak_ptr<libtorrent::aux::peer_connection,void>
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_200 + 0x10),
               (shared_ptr<libtorrent::aux::peer_connection> *)local_200);
    peer_connection_handle::peer_connection_handle
              ((peer_connection_handle *)(local_200 + 0x20),
               (weak_ptr<libtorrent::aux::peer_connection> *)(local_200 + 0x10));
    (*peVar14->_vptr_torrent_plugin[2])(local_1d0,peVar14,local_200 + 0x20);
    peer_connection_handle::~peer_connection_handle((peer_connection_handle *)(local_200 + 0x20));
    ::std::weak_ptr<libtorrent::aux::peer_connection>::~weak_ptr
              ((weak_ptr<libtorrent::aux::peer_connection> *)(local_200 + 0x10));
    ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
              ((shared_ptr<libtorrent::aux::peer_connection> *)local_200);
    bVar4 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d0);
    uVar15 = local_20;
    if (bVar4) {
      this_00 = &st.erased.
                 super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ::std::shared_ptr<libtorrent::peer_plugin>::shared_ptr
                ((shared_ptr<libtorrent::peer_plugin> *)this_00,
                 (shared_ptr<libtorrent::peer_plugin> *)local_1d0);
      peer_connection::add_extension
                ((peer_connection *)uVar15,(shared_ptr<libtorrent::peer_plugin> *)this_00);
      ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr
                ((shared_ptr<libtorrent::peer_plugin> *)
                 &st.erased.
                  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ::std::shared_ptr<libtorrent::peer_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::peer_plugin> *)local_1d0);
    ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
  }
  get_peer_list_state((torrent_state *)local_2c0,this);
  need_peer_list(this);
  this_02 = ::std::
            unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ::operator->(&(this->super_torrent_hot_members).m_peer_list);
  c_02 = (peer_connection_interface *)(local_20 + 0x80);
  uVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0xf])();
  bVar4 = peer_list::new_connection(this_02,c_02,uVar6 & 0xffff,(torrent_state *)local_2c0);
  if (bVar4) {
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    sVar16 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::size(&(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::reserve(&this->m_peers_to_disconnect,sVar16 + 1);
    this_03 = &(this->super_torrent_hot_members).m_connections;
    sVar16 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::size(&this_03->
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   );
    container_wrapper<libtorrent::aux::peer_connection_*,_int,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::reserve(this_03,sVar16 + 1);
    if ((i_1._M_current._7_1_ & 1) == 0) {
LAB_0069185c:
      if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
        recalc_share_mode(this);
      }
      sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*>
                (&(this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ,(peer_connection *)local_20);
      update_want_peers(this);
      update_want_tick(this);
      lVar17 = (**(code **)(*(long *)local_20 + 0x38))();
      if ((lVar17 != 0) &&
         (lVar17 = (**(code **)(*(long *)local_20 + 0x38))(),
         (*(uint *)(lVar17 + 0x1b) >> 7 & 1) != 0)) {
        this->m_num_seeds = this->m_num_seeds + 1;
      }
      uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
      if ((uVar6 & 1) != 0) {
        auVar19 = (**(code **)(*(long *)local_20 + 0x80))();
        print_endpoint_abi_cxx11_((string *)&anon_var_0,auVar19._0_8_,auVar19._8_8_);
        uVar18 = ::std::__cxx11::string::c_str();
        uVar6 = num_peers(this);
        uVar15 = *(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
        uVar10 = num_peers(this);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d",uVar18,
                   (ulong)uVar6,(ulong)((uint)((ulong)uVar15 >> 0x21) & 0xffffff),(ulong)uVar10);
        ::std::__cxx11::string::~string((string *)&anon_var_0);
      }
      this_local._7_1_ = 1;
    }
    else {
      local_300._vptr_peer_connection_interface = (_func_int **)find_lowest_ranking_peer(this);
      if ((peer_connection *)local_300._vptr_peer_connection_interface != (peer_connection *)0x0) {
        uVar8 = peer_connection::peer_rank
                          ((peer_connection *)local_300._vptr_peer_connection_interface);
        uVar9 = peer_connection::peer_rank((peer_connection *)local_20);
        if (uVar8 < uVar9) {
          uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
          if ((uVar6 & 1) != 0) {
            auVar19 = (**(code **)(*local_300._vptr_peer_connection_interface + 0x80))();
            print_endpoint_abi_cxx11_(&local_320,auVar19._0_8_,auVar19._8_8_);
            uVar15 = ::std::__cxx11::string::c_str();
            uVar6 = num_peers(this);
            (*(this->super_request_callback)._vptr_request_callback[7])
                      (this,
                       "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                       ,uVar15,(ulong)uVar6,
                       (ulong)((uint)((ulong)*(undefined8 *)
                                              &(this->super_torrent_hot_members).field_0x48 >> 0x21)
                              & 0xffffff));
            ::std::__cxx11::string::~string((string *)&local_320);
          }
          pVar3._vptr_peer_connection_interface = local_300._vptr_peer_connection_interface;
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_330,too_many_connections,(type *)0x0);
          local_331 = 0;
          (**(code **)(*pVar3._vptr_peer_connection_interface + 0xa0))
                    (pVar3._vptr_peer_connection_interface,&local_330,1,0);
          peer_connection::peer_disconnected_other((peer_connection *)local_20);
          goto LAB_0069185c;
        }
      }
      uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
      if ((uVar6 & 1) != 0) {
        auVar19 = (**(code **)(*(long *)local_20 + 0x80))();
        print_endpoint_abi_cxx11_((string *)(local_380 + 0x28),auVar19._0_8_,auVar19._8_8_);
        uVar15 = ::std::__cxx11::string::c_str();
        uVar6 = num_peers(this);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,
                   "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                   ,uVar15,(ulong)uVar6,
                   (ulong)((uint)((ulong)*(undefined8 *)
                                          &(this->super_torrent_hot_members).field_0x48 >> 0x21) &
                          0xffffff));
        ::std::__cxx11::string::~string((string *)(local_380 + 0x28));
      }
      uVar15 = local_20;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                ((error_code *)(local_380 + 0x18),too_many_connections,(type *)0x0);
      local_380[0x17] = 0;
      (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,(error_code *)(local_380 + 0x18),1,0);
      peer_connection::self((peer_connection *)local_380);
      remove_peer(this,(shared_ptr<libtorrent::aux::peer_connection> *)local_380);
      ::std::shared_ptr<libtorrent::aux::peer_connection>::~shared_ptr
                ((shared_ptr<libtorrent::aux::peer_connection> *)local_380);
      this_local._7_1_ = 0;
    }
  }
  else {
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    uVar6 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar6 & 1) != 0) {
      auVar19 = (**(code **)(*(long *)local_20 + 0x80))();
      print_endpoint_abi_cxx11_(&local_2e0,auVar19._0_8_,auVar19._8_8_);
      uVar15 = ::std::__cxx11::string::c_str();
      uVar6 = num_peers(this);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"CLOSING CONNECTION \"%s\" peer list full connections: %d limit: %d",uVar15,
                 (ulong)uVar6,
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
      ::std::__cxx11::string::~string((string *)&local_2e0);
    }
    uVar15 = local_20;
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_2f0,too_many_connections,(type *)0x0);
    peer._7_1_ = 0;
    (**(code **)(*(long *)uVar15 + 0xa0))(uVar15,&local_2f0,1,0);
    this_local._7_1_ = 0;
  }
  peer._0_4_ = 1;
  torrent_state::~torrent_state((torrent_state *)local_2c0);
LAB_00691b47:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool torrent::attach_peer(peer_connection* p) try
	{
//		INVARIANT_CHECK;

#ifdef TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// if this is an SSL torrent, don't allow non SSL peers on it
			aux::socket_type& s = p->get_socket();

			ssl::stream_handle_type stream_handle = std::visit(ssl_handle_visitor{}, s.var());

			if (!stream_handle)
			{
				// don't allow non SSL peers on SSL torrents
				p->disconnect(errors::requires_ssl_connection, operation_t::bittorrent);
				return false;
			}

			if (!m_ssl_ctx)
			{
				// we don't have a valid cert, don't accept any connection!
				p->disconnect(errors::invalid_ssl_cert, operation_t::ssl_handshake);
				return false;
			}

			if (!ssl::has_context(stream_handle, ssl::get_handle(*m_ssl_ctx)))
			{
				// if the SSL context associated with this connection is
				// not the one belonging to this torrent, the SSL handshake
				// connected to one torrent, and the BitTorrent protocol
				// to a different one. This is probably an attempt to circumvent
				// access control. Don't allow it.
				p->disconnect(errors::invalid_ssl_cert, operation_t::bittorrent);
				return false;
			}
		}
#else // TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// Don't accidentally allow seeding of SSL torrents, just
			// because libtorrent wasn't built with SSL support
			p->disconnect(errors::requires_ssl_connection, operation_t::ssl_handshake);
			return false;
		}
#endif // TORRENT_SSL_PEERS

		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(!p->is_outgoing());

		m_has_incoming = true;

		if (m_apply_ip_filter
			&& m_ip_filter
			&& m_ip_filter->access(p->remote().address()) & ip_filter::blocked)
		{
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, p->remote(), peer_blocked_alert::ip_filter);
			p->disconnect(errors::banned_by_ip_filter, operation_t::bittorrent);
			return false;
		}

		if (!is_downloading_state(m_state) && valid_metadata())
		{
			p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
			return false;
		}

		if (!m_ses.has_connection(p))
		{
			p->disconnect(errors::peer_not_constructed, operation_t::bittorrent);
			return false;
		}

		if (m_ses.is_aborted())
		{
			p->disconnect(errors::session_closing, operation_t::bittorrent);
			return false;
		}

		int connection_limit_factor = 0;
		for (int i = 0; i < p->num_classes(); ++i)
		{
			peer_class_t pc = p->class_at(i);
			if (m_ses.peer_classes().at(pc) == nullptr) continue;
			int f = m_ses.peer_classes().at(pc)->connection_limit_factor;
			if (connection_limit_factor < f) connection_limit_factor = f;
		}
		if (connection_limit_factor == 0) connection_limit_factor = 100;

		std::int64_t const limit = std::int64_t(m_max_connections) * 100 / connection_limit_factor;

		bool maybe_replace_peer = false;

		if (m_connections.end_index() >= limit)
		{
			// if more than 10% of the connections are outgoing
			// connection attempts that haven't completed yet,
			// disconnect one of them and let this incoming
			// connection through.
			if (m_num_connecting > m_max_connections / 10)
			{
				// find one of the connecting peers and disconnect it
				// find any peer that's connecting (i.e. a half-open TCP connection)
				// that's also not disconnecting
				// disconnect the peer that's been waiting to establish a connection
				// the longest
				auto i = std::max_element(begin(), end(), &connecting_time_compare);

				if (i == end() || !(*i)->is_connecting() || (*i)->is_disconnecting())
				{
					// this seems odd, but we might as well handle it
					p->disconnect(errors::too_many_connections, operation_t::bittorrent);
					return false;
				}
				(*i)->disconnect(errors::too_many_connections, operation_t::bittorrent);

				// if this peer was let in via connections slack,
				// it has done its duty of causing the disconnection
				// of another peer
				p->peer_disconnected_other();
			}
			else
			{
				maybe_replace_peer = true;
			}
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			std::shared_ptr<peer_plugin> pp(ext->new_connection(
					peer_connection_handle(p->self())));
			if (pp) p->add_extension(pp);
		}
#endif
		torrent_state st = get_peer_list_state();
		need_peer_list();
		if (!m_peer_list->new_connection(*p, m_ses.session_time(), &st))
		{
			peers_erased(st.erased);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("CLOSING CONNECTION \"%s\" peer list full "
					"connections: %d limit: %d"
					, print_endpoint(p->remote()).c_str()
					, num_peers()
					, m_max_connections);
			}
#endif
			p->disconnect(errors::too_many_connections, operation_t::bittorrent);
			return false;
		}
		peers_erased(st.erased);

		m_peers_to_disconnect.reserve(m_connections.size() + 1);
		m_connections.reserve(m_connections.size() + 1);

#if TORRENT_USE_ASSERTS
		error_code ec;
		TORRENT_ASSERT(p->remote() == p->get_socket().remote_endpoint(ec) || ec);
#endif

		TORRENT_ASSERT(p->peer_info_struct() != nullptr);

		// we need to do this after we've added the peer to the peer_list
		// since that's when the peer is assigned its peer_info object,
		// which holds the rank
		if (maybe_replace_peer)
		{
			// now, find the lowest rank peer and disconnect that
			// if it's lower rank than the incoming connection
			peer_connection* peer = find_lowest_ranking_peer();

			// TODO: 2 if peer is a really good peer, maybe we shouldn't disconnect it
			// perhaps this logic should be disabled if we have too many idle peers
			// (with some definition of idle)
			if (peer != nullptr && peer->peer_rank() < p->peer_rank())
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(peer->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				peer->disconnect(errors::too_many_connections, operation_t::bittorrent);
				p->peer_disconnected_other();
			}
			else
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(p->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				p->disconnect(errors::too_many_connections, operation_t::bittorrent);
				// we have to do this here because from the peer's point of view
				// it wasn't really attached to the torrent, but we do need
				// to let peer_list know we're removing it
				remove_peer(p->self());
				return false;
			}
		}

#if TORRENT_USE_INVARIANT_CHECKS
		if (m_peer_list) m_peer_list->check_invariant();
#endif

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode)
			recalc_share_mode();
#endif

		// once we add the peer to our m_connections list, we can't throw an
		// exception. That will end up violating an invariant between the session,
		// torrent and peers
		TORRENT_ASSERT(sorted_find(m_connections, p) == m_connections.end());
		TORRENT_ASSERT(m_iterating_connections == 0);
		sorted_insert(m_connections, p);
		update_want_peers();
		update_want_tick();

		if (p->peer_info_struct() && p->peer_info_struct()->seed)
		{
			TORRENT_ASSERT(m_num_seeds < 0xffff);
			++m_num_seeds;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log()) try
		{
			debug_log("ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d"
				, print_endpoint(p->remote()).c_str(), num_peers()
				, m_max_connections
				, num_peers());
		}
		catch (std::exception const&) {}
#endif

		return true;
	}
	catch (...)
	{
		p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
		// from the peer's point of view it was never really added to the torrent.
		// So we need to clean it up here before propagating the error
		remove_peer(p->self());
		return false;
	}